

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
units::find_unit_pair_abi_cxx11_
          (pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,units *this,unit un)

{
  bool bVar1;
  pointer __x;
  pointer ppVar2;
  pointer __x_00;
  pointer pvVar3;
  _Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> local_38;
  _Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> local_30;
  const_iterator fnd;
  _Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_20;
  iterator fndud;
  unit un_local;
  
  fndud.
  super__Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               )this;
  bVar1 = std::atomic<bool>::load((atomic<bool> *)&allowUserDefinedUnits,memory_order_acquire);
  if ((bVar1) &&
     (bVar1 = std::
              unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)user_defined_unit_names_abi_cxx11_), !bVar1)) {
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)user_defined_unit_names_abi_cxx11_,(key_type *)&fndud);
    fnd.super__Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true>._M_cur =
         (_Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true>)
         std::
         unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)user_defined_unit_names_abi_cxx11_);
    bVar1 = std::__detail::operator!=
                      (&local_20,
                       (_Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        *)&fnd);
    if (bVar1) {
      __x = std::__detail::
            _Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
            ::operator->((_Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                          *)&local_20);
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)&local_20);
      std::
      pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (__return_storage_ptr__,&__x->first,&ppVar2->second);
      return __return_storage_ptr__;
    }
  }
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
       ::find((unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
               *)base_unit_names,(key_type *)&fndud);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
       ::end((unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
              *)base_unit_names);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    __x_00 = std::__detail::
             _Node_const_iterator<std::pair<const_units::unit,_const_char_*>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_units::unit,_const_char_*>,_false,_true>
                         *)&local_30);
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_units::unit,_const_char_*>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_units::unit,_const_char_*>,_false,_true>
                         *)&local_30);
    std::
    pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_*const_&,_true>(__return_storage_ptr__,&__x_00->first,&pvVar3->second);
  }
  else {
    std::
    pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,
               (pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)nullret_abi_cxx11_);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::pair<unit, std::string> find_unit_pair(unit un)
{  // cppcheck suppression active
    if (allowUserDefinedUnits.load(std::memory_order_acquire)) {
        if (!user_defined_unit_names.empty()) {
            auto fndud = user_defined_unit_names.find(un);
            if (fndud != user_defined_unit_names.end()) {
                return {fndud->first, fndud->second};
            }
        }
    }
    auto fnd = base_unit_names.find(un);
    if (fnd != base_unit_names.end()) {
        return {fnd->first, fnd->second};
    }
    return nullret;
}